

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O0

char * begin_dump(int how)

{
  int __fd;
  tm *__tp;
  size_t sVar1;
  char *local_248;
  int dumpfd;
  tm *tmp;
  time_t t;
  char *rolename;
  char *status;
  char timestamp [256];
  char dumpname_tmp [256];
  char *pcStack_10;
  int how_local;
  
  memcpy(&winprocs_original,&windowprocs,0x90);
  tmp = (tm *)time((time_t *)0x0);
  __tp = localtime((time_t *)&tmp);
  if (__tp != (tm *)0x0) {
    sVar1 = strftime((char *)&status,0x100,"%Y-%m-%d %H_%M_%S",__tp);
    if (sVar1 != 0) goto LAB_001bbf8b;
  }
  strcpy((char *)&status,"???");
LAB_001bbf8b:
  if (how == 0xe) {
    rolename = "quit";
  }
  else if (how == 0xf) {
    rolename = "escaped";
  }
  else if (how == 0x11) {
    rolename = "ascended";
  }
  else {
    rolename = "died";
  }
  sprintf(timestamp + 0xf8,"%s, %s-%s-%s-%s-%s, %s.txt",&status,plname,urole.filecode,urace.filecode
          ,genders[flags.female].filecode,aligns[1 - u.ualign.type].filecode,rolename);
  munge_xlstring(begin_dump::dumpname,timestamp + 0xf8,0x100);
  dumpfp = fopen_datafile(begin_dump::dumpname,"w+",5);
  if ((FILE *)dumpfp == (FILE *)0x0) {
    pcStack_10 = (char *)0x0;
  }
  else {
    __fd = fileno((FILE *)dumpfp);
    if (__fd != -1) {
      fchmod(__fd,0x1a4);
    }
    if ((flags.female == '\0') || (urole.name.f == (char *)0x0)) {
      local_248 = urole.name.m;
    }
    else {
      local_248 = urole.name.f;
    }
    t = (time_t)local_248;
    fprintf((FILE *)dumpfp,"%s, %s %s %s %s\n",plname,aligns[1 - u.ualign.type].adj,
            genders[flags.female].adj,urace.adj,local_248);
    dump_screen(dumpfp);
    dump_status();
    pcStack_10 = begin_dump::dumpname;
  }
  return pcStack_10;
}

Assistant:

const char *begin_dump(int how)
{
    /* must be static, may be passed out of this function */
    static char dumpname[BUFSZ];

    char dumpname_tmp[BUFSZ], timestamp[BUFSZ], *status;
    const char *rolename;
    time_t t;
    struct tm *tmp;
#ifdef UNIX
    int dumpfd;
#endif

    /* back up the window procs */
    winprocs_original = windowprocs;

    /* make a timestamp like "2011-11-30 18:45:01" */
    t = time(NULL);
    tmp = localtime(&t);
    if (!tmp || !strftime(timestamp, sizeof(timestamp), "%Y-%m-%d %H_%M_%S", tmp))
	strcpy(timestamp, "???");

    switch(how) {
	case ASCENDED:	status = "ascended"; break;
	case QUIT:	status = "quit"; break;
	case ESCAPED:	status = "escaped"; break;
	default:	status = "died"; break;
    }

    sprintf(dumpname_tmp, "%s, %s-%s-%s-%s-%s, %s.txt", timestamp, plname,
	    urole.filecode, urace.filecode, genders[flags.female].filecode,
	    aligns[1-u.ualign.type].filecode, status);

    /* Run this through munge_xlstring() here rather than when writing to
     * xlogfile, so the filename here will match the one eventually written to
     * the xlogfile.
     */
    munge_xlstring(dumpname, dumpname_tmp, sizeof(dumpname));

    dumpfp = fopen_datafile(dumpname, "w+", DUMPPREFIX);
    if (!dumpfp)
	return NULL;

#ifdef UNIX
    /* 644 permissions for dumplogs */
    dumpfd = fileno(dumpfp);
    if (dumpfd != -1)
	fchmod(dumpfd, 0644);
#endif

    rolename = (flags.female && urole.name.f) ? urole.name.f : urole.name.m;
    fprintf(dumpfp, "%s, %s %s %s %s\n", plname, aligns[1-u.ualign.type].adj,
	    genders[flags.female].adj, urace.adj, rolename);

    dump_screen(dumpfp);
    dump_status();

    return dumpname;
}